

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestCamelCaseFieldNames::_InternalSerialize
          (TestCamelCaseFieldNames *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ForeignMessage *value;
  const_reference pbVar1;
  bool bVar2;
  int32_t value_00;
  ForeignEnum value_01;
  int iVar3;
  uint uVar4;
  Scalar SVar5;
  uint32_t *puVar6;
  WireFormatLite *pWVar7;
  size_type sVar8;
  uint8_t *puVar9;
  RepeatedField<int> *pRVar10;
  const_pointer piVar11;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar12;
  size_t sVar13;
  void *pvVar14;
  LogMessage *pLVar15;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  byte bVar16;
  const_pointer piVar17;
  void *pvVar18;
  char *in_R9;
  string_view sVar19;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  basic_string_view<char,_std::char_traits<char>_> local_3f0;
  const_reference local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_2;
  int n_3;
  int i_3;
  char *local_3c8;
  const_reference local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  int n_2;
  int i_2;
  ForeignMessage *repfield;
  uint n_1;
  uint i_1;
  size_t byte_size_1;
  char *local_390;
  const_reference local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int local_378;
  int n;
  int i;
  int byte_size;
  char *local_368;
  basic_string_view<char,_std::char_traits<char>_> local_360;
  string *local_350;
  string *_s_2;
  size_t local_340;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  undefined1 local_328 [8];
  string_view _s_1;
  basic_string_view<char,_std::char_traits<char>_> local_308;
  undefined1 local_2f8 [8];
  string_view _s;
  uint32_t cached_has_bits;
  TestCamelCaseFieldNames *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestCamelCaseFieldNames *this_local;
  ptrdiff_t size_2;
  EpsCopyOutputStream *local_260;
  ptrdiff_t size_1;
  EpsCopyOutputStream *local_220;
  ptrdiff_t size;
  EpsCopyOutputStream *local_1e0;
  EpsCopyOutputStream *local_1b0;
  EpsCopyOutputStream *local_1a0;
  EpsCopyOutputStream *local_190;
  const_pointer end_1;
  const_pointer it_1;
  EpsCopyOutputStream *local_168;
  byte *local_140;
  ulong local_138;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_118;
  byte *local_f0;
  ulong local_e8;
  LogMessage local_a8;
  Voidify local_91;
  byte *local_90;
  undefined4 local_88;
  undefined4 local_84;
  EpsCopyOutputStream *local_80;
  byte *local_78;
  uint local_70;
  byte local_69;
  LogMessage local_68;
  Voidify local_51;
  byte *local_50;
  uint local_48;
  int local_44;
  EpsCopyOutputStream *local_40;
  byte *local_38;
  uint local_2c;
  EpsCopyOutputStream *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  _s._M_str._4_4_ = 0;
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._M_str._4_4_ = *puVar6;
  stream_local = (EpsCopyOutputStream *)target;
  if ((_s._M_str._4_4_ & 0x10) != 0) {
    value_00 = _internal_primitivefield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,value_00,target);
  }
  if ((_s._M_str._4_4_ & 1) != 0) {
    _local_2f8 = _internal_stringfield(this);
    pWVar7 = (WireFormatLite *)
             std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_2f8);
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_2f8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_308,"edition_unittest.TestCamelCaseFieldNames.StringField");
    sVar19._M_str = in_R9;
    sVar19._M_len = (size_t)local_308._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar7,(char *)(sVar8 & 0xffffffff),1,(Operation)local_308._M_len,sVar19);
    _s_1._M_str = (char *)local_2f8;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,_local_2f8,(uint8_t *)stream_local);
  }
  if ((_s._M_str._4_4_ & 0x20) != 0) {
    puVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _internal_enumfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(3,value_01,puVar9);
  }
  if ((_s._M_str._4_4_ & 8) != 0) {
    value = (this->field_0)._impl_.messagefield_;
    iVar3 = edition_unittest::ForeignMessage::GetCachedSize((this->field_0)._impl_.messagefield_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)value,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((_s._M_str._4_4_ & 2) != 0) {
    _local_328 = _internal_stringpiecefield(this);
    pWVar7 = (WireFormatLite *)
             std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_328);
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_328);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_338,"edition_unittest.TestCamelCaseFieldNames.StringPieceField");
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)local_338._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar7,(char *)(sVar8 & 0xffffffff),1,(Operation)local_338._M_len,field_name);
    _s_2 = (string *)local_328;
    local_340 = _s_1._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,5,_local_328,(uint8_t *)stream_local);
  }
  if ((_s._M_str._4_4_ & 4) != 0) {
    local_350 = _internal_cordfield_abi_cxx11_(this);
    pWVar7 = (WireFormatLite *)std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_360,"edition_unittest.TestCamelCaseFieldNames.CordField");
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)local_360._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar7,(char *)(ulong)uVar4,1,(Operation)local_360._M_len,field_name_00);
    _i = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_350);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,6,_i,(uint8_t *)stream_local);
  }
  n = google::protobuf::internal::CachedSize::Get
                (&(this->field_0)._impl_._repeatedprimitivefield_cached_byte_size_);
  if (0 < n) {
    pRVar10 = _internal_repeatedprimitivefield(this);
    iVar3 = n;
    local_50 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_44 = 7;
    local_48 = 2;
    local_69 = 0;
    local_40 = stream;
    if (stream->end_ <= local_50) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_69 = 1;
      pLVar15 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar15);
    }
    if ((local_69 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    }
    local_38 = local_50;
    for (local_2c = local_44 << 3 | local_48; 0x7f < local_2c; local_2c = local_2c >> 7) {
      *local_38 = (byte)local_2c | 0x80;
      local_38 = local_38 + 1;
    }
    *local_38 = (byte)local_2c;
    local_18 = (EpsCopyOutputStream *)(local_38 + 1);
    for (local_c = iVar3; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_118 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_38 = local_38 + 1;
    local_18 = local_118;
    piVar11 = google::protobuf::RepeatedField<int>::data(pRVar10);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar10);
    end = piVar11;
    do {
      local_f0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_118)
      ;
      piVar17 = end + 1;
      local_e8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
      for (; 0x7f < local_e8; local_e8 = local_e8 >> 7) {
        *local_f0 = (byte)local_e8 | 0x80;
        local_f0 = local_f0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_f0 + 1);
      *local_f0 = (byte)local_e8;
      end = piVar17;
      local_118 = stream_local;
    } while (piVar17 < piVar11 + iVar3);
  }
  local_378 = 0;
  s._4_4_ = _internal_repeatedstringfield_size(this);
  for (; local_378 < s._4_4_; local_378 = local_378 + 1) {
    pRVar12 = _internal_repeatedstringfield_abi_cxx11_(this);
    local_388 = google::protobuf::
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar12,local_378);
    pWVar7 = (WireFormatLite *)std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&byte_size_1,
               "edition_unittest.TestCamelCaseFieldNames.RepeatedStringField");
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)local_390;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar7,(char *)(ulong)uVar4,1,(Operation)byte_size_1,field_name_01);
    pbVar1 = local_388;
    sVar13 = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)sVar13 < 0x80) {
      puVar9 = stream->end_;
      iVar3 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x40);
      bVar2 = (long)(puVar9 + (-(long)iVar3 - (long)stream_local) + 0xf) < (long)sVar13;
    }
    if (bVar2) {
      sVar19 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar1);
      local_1e0 = (EpsCopyOutputStream *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (stream,8,sVar19,(uint8_t *)stream_local);
    }
    else {
      local_1b0 = stream_local;
      bVar16 = 0x42;
      while (0x7f < bVar16) {
        *(byte *)&local_1b0->end_ = bVar16 | 0x80;
        local_1b0 = (EpsCopyOutputStream *)((long)&local_1b0->end_ + 1);
        bVar16 = 0;
      }
      *(byte *)&local_1b0->end_ = bVar16;
      pvVar18 = (void *)((long)&local_1b0->end_ + 2);
      *(char *)((long)&local_1b0->end_ + 1) = (char)sVar13;
      pvVar14 = (void *)std::__cxx11::string::data();
      memcpy(pvVar18,pvVar14,sVar13);
      local_1e0 = (EpsCopyOutputStream *)((long)pvVar18 + sVar13);
    }
    stream_local = local_1e0;
  }
  SVar5 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeatedenumfield_cached_byte_size_);
  _n_1 = (long)SVar5;
  if (_n_1 != 0) {
    pRVar10 = _internal_repeatedenumfield(this);
    uVar4 = (uint)_n_1;
    local_90 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_84 = 9;
    local_88 = 2;
    local_80 = stream;
    if (stream->end_ <= local_90) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar15 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar15);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
    local_70 = 0x4a;
    local_78 = local_90;
    while (0x7f < local_70) {
      *local_78 = (byte)local_70 | 0x80;
      local_78 = local_78 + 1;
      local_70 = 0;
    }
    *local_78 = (byte)local_70;
    local_28 = (EpsCopyOutputStream *)(local_78 + 1);
    for (local_1c = uVar4; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *(byte *)local_28 = (byte)local_1c | 0x80;
      local_28 = (EpsCopyOutputStream *)((long)local_28 + 1);
    }
    local_168 = (EpsCopyOutputStream *)((long)local_28 + 1);
    *(byte *)local_28 = (byte)local_1c;
    local_78 = local_78 + 1;
    local_28 = local_168;
    piVar11 = google::protobuf::RepeatedField<int>::data(pRVar10);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar10);
    end_1 = piVar11;
    do {
      local_140 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_168);
      piVar17 = end_1 + 1;
      local_138 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_1);
      for (; 0x7f < local_138; local_138 = local_138 >> 7) {
        *local_140 = (byte)local_138 | 0x80;
        local_140 = local_140 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_140 + 1);
      *local_140 = (byte)local_138;
      end_1 = piVar17;
      local_168 = stream_local;
    } while (piVar17 < piVar11 + iVar3);
  }
  repfield._4_4_ = 0;
  repfield._0_4_ = _internal_repeatedmessagefield_size(this);
  for (; repfield._4_4_ < (uint)repfield; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_repeatedmessagefield(this);
    this_01 = google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::Get
                        (this_00,repfield._4_4_);
    _n_2 = this_01;
    iVar3 = edition_unittest::ForeignMessage::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (10,(MessageLite *)this_01,iVar3,(uint8_t *)stream_local,stream);
  }
  s_1._4_4_ = 0;
  s_1._0_4_ = _internal_repeatedstringpiecefield_size(this);
  for (; s_1._4_4_ < (int)s_1; s_1._4_4_ = s_1._4_4_ + 1) {
    pRVar12 = _internal_repeatedstringpiecefield_abi_cxx11_(this);
    local_3c0 = google::protobuf::
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar12,s_1._4_4_);
    pWVar7 = (WireFormatLite *)std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&n_3,
               "edition_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField");
    field_name_02._M_str = in_R9;
    field_name_02._M_len = (size_t)local_3c8;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar7,(char *)(ulong)uVar4,1,(Operation)_n_3,field_name_02);
    pbVar1 = local_3c0;
    sVar13 = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)sVar13 < 0x80) {
      puVar9 = stream->end_;
      iVar3 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x58);
      bVar2 = (long)(puVar9 + (-(long)iVar3 - (long)stream_local) + 0xf) < (long)sVar13;
    }
    if (bVar2) {
      sVar19 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar1);
      local_220 = (EpsCopyOutputStream *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (stream,0xb,sVar19,(uint8_t *)stream_local);
    }
    else {
      local_1a0 = stream_local;
      bVar16 = 0x5a;
      while (0x7f < bVar16) {
        *(byte *)&local_1a0->end_ = bVar16 | 0x80;
        local_1a0 = (EpsCopyOutputStream *)((long)&local_1a0->end_ + 1);
        bVar16 = 0;
      }
      *(byte *)&local_1a0->end_ = bVar16;
      pvVar18 = (void *)((long)&local_1a0->end_ + 2);
      *(char *)((long)&local_1a0->end_ + 1) = (char)sVar13;
      pvVar14 = (void *)std::__cxx11::string::data();
      memcpy(pvVar18,pvVar14,sVar13);
      local_220 = (EpsCopyOutputStream *)((long)pvVar18 + sVar13);
    }
    stream_local = local_220;
  }
  s_2._4_4_ = 0;
  s_2._0_4_ = _internal_repeatedcordfield_size(this);
  for (; s_2._4_4_ < (int)s_2; s_2._4_4_ = s_2._4_4_ + 1) {
    pRVar12 = _internal_repeatedcordfield_abi_cxx11_(this);
    local_3e0 = google::protobuf::
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar12,s_2._4_4_);
    pWVar7 = (WireFormatLite *)std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3f0,"edition_unittest.TestCamelCaseFieldNames.RepeatedCordField");
    field_name_03._M_str = in_R9;
    field_name_03._M_len = (size_t)local_3f0._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar7,(char *)(ulong)uVar4,1,(Operation)local_3f0._M_len,field_name_03);
    pbVar1 = local_3e0;
    sVar13 = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)sVar13 < 0x80) {
      puVar9 = stream->end_;
      iVar3 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x60);
      bVar2 = (long)(puVar9 + (-(long)iVar3 - (long)stream_local) + 0xf) < (long)sVar13;
    }
    if (bVar2) {
      sVar19 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar1);
      local_260 = (EpsCopyOutputStream *)
                  google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                            (stream,0xc,sVar19,(uint8_t *)stream_local);
    }
    else {
      local_190 = stream_local;
      bVar16 = 0x62;
      while (0x7f < bVar16) {
        *(byte *)&local_190->end_ = bVar16 | 0x80;
        local_190 = (EpsCopyOutputStream *)((long)&local_190->end_ + 1);
        bVar16 = 0;
      }
      *(byte *)&local_190->end_ = bVar16;
      pvVar18 = (void *)((long)&local_190->end_ + 2);
      *(char *)((long)&local_190->end_ + 1) = (char)sVar13;
      pvVar14 = (void *)std::__cxx11::string::data();
      memcpy(pvVar18,pvVar14,sVar13);
      local_260 = (EpsCopyOutputStream *)((long)pvVar18 + sVar13);
    }
    stream_local = local_260;
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestCamelCaseFieldNames::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestCamelCaseFieldNames)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 PrimitiveField = 1;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_primitivefield(), target);
  }

  // string StringField = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_stringfield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.StringField");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // .edition_unittest.ForeignEnum EnumField = 3;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_enumfield(), target);
  }

  // .edition_unittest.ForeignMessage MessageField = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.messagefield_, this_._impl_.messagefield_->GetCachedSize(), target,
        stream);
  }

  // string StringPieceField = 5 [ctype = STRING_PIECE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::absl::string_view _s = this_._internal_stringpiecefield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.StringPieceField");
    target = stream->WriteStringMaybeAliased(5, _s, target);
  }

  // string CordField = 6 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_cordfield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.CordField");
    target = stream->WriteStringMaybeAliased(6, _s, target);
  }

  // repeated int32 RepeatedPrimitiveField = 7;
  {
    int byte_size = this_._impl_._repeatedprimitivefield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          7, this_._internal_repeatedprimitivefield(), byte_size, target);
    }
  }

  // repeated string RepeatedStringField = 8;
  for (int i = 0, n = this_._internal_repeatedstringfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringfield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedStringField");
    target = stream->WriteString(8, s, target);
  }

  // repeated .edition_unittest.ForeignEnum RepeatedEnumField = 9;
  {
    ::size_t byte_size = this_._impl_._repeatedenumfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          9, this_._internal_repeatedenumfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.ForeignMessage RepeatedMessageField = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeatedmessagefield_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeatedmessagefield().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
  for (int i = 0, n = this_._internal_repeatedstringpiecefield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringpiecefield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField");
    target = stream->WriteString(11, s, target);
  }

  // repeated string RepeatedCordField = 12 [ctype = CORD];
  for (int i = 0, n = this_._internal_repeatedcordfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedcordfield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedCordField");
    target = stream->WriteString(12, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestCamelCaseFieldNames)
  return target;
}